

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

Reference __thiscall
mp::internal::
NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
::ReadReference(NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                *this)

{
  TextReader<fmt::Locale> *this_00;
  char *loc;
  Reference RVar1;
  undefined8 local_28;
  undefined8 uStack_20;
  ArgList local_18;
  
  this_00 = this->reader_;
  loc = (this_00->super_ReaderBase).ptr_;
  (this_00->super_ReaderBase).token_ = loc;
  (this_00->super_ReaderBase).ptr_ = loc + 1;
  if (*loc != 'v') {
    local_28 = 0;
    uStack_20 = 0;
    local_18.types_ = 0;
    local_18.field_1.values_ = (Value *)&local_28;
    TextReader<fmt::Locale>::DoReportError(this_00,loc,(CStringRef)0x172583,&local_18);
  }
  RVar1 = DoReadReference(this);
  return (Reference)RVar1.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_
  ;
}

Assistant:

Reference ReadReference() {
    if (reader_.ReadChar() != 'v')
      reader_.ReportError("expected reference");
    return DoReadReference();
  }